

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O2

bool __thiscall Mechanization::UpdatePosi(Mechanization *this,Output now)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  ELLIPSOID type;
  ELLIPSOID type_00;
  Euler eu;
  ELLIPSOID type_01;
  ELLIPSOID type_02;
  long lVar7;
  long lVar8;
  Mechanization *pMVar9;
  double *pdVar10;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> **ppMVar11;
  QuaternionBase<Eigen::Quaternion<double,0>> *pQVar12;
  undefined8 *puVar13;
  double *pdVar14;
  double *pdVar15;
  Matrix3d *pMVar16;
  Matrix3d *C;
  undefined8 *puVar17;
  byte bVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  ELLIPSOID in_stack_fffffffffffffba8;
  double in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  double in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc90 [40];
  double dStack_328;
  Quaterniond QStack_310;
  int aiStack_2f0 [8];
  double dStack_2d0;
  undefined4 uStack_2c8;
  uint uStack_2c4;
  undefined4 uStack_2c0;
  uint uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  StorageBaseType aSStack_2b0 [32];
  QuaternionBase<Eigen::Quaternion<double,0>> aQStack_290 [8];
  LhsNested in_stack_fffffffffffffd78;
  scalar_constant_op<double> in_stack_fffffffffffffd80;
  RhsNested in_stack_fffffffffffffd88;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *apMStack_248 [8];
  Euler in_stack_fffffffffffffdf8;
  Vector3d VStack_1f0;
  undefined1 auStack_1d0 [16];
  double dStack_1c0;
  Vector3d VStack_1b0;
  double dStack_190;
  double dStack_188;
  double dStack_180;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  Vector3d VStack_150;
  Matrix<double,_3,_1,_0,_3,_1> MStack_138;
  double adStack_120 [3];
  Matrix<double,_3,_1,_0,_3,_1> MStack_108;
  QuaternionBase<Eigen::Quaternion<double,_0>_> aQStack_f0 [32];
  Matrix3d MStack_d0;
  Mechanization *pMStack_88;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0 [32];
  
  bVar18 = 0;
  dVar22 = (this->prvPosi).B;
  (this->nowPosi).H =
       (this->prvPosi).H -
       (((this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2] +
        (this->nowVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[2]) * 0.5) / 200.0;
  lVar8 = 9;
  pMVar9 = this;
  pdVar14 = (double *)&stack0xffffffffffffffa8;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar14 = (pMVar9->type).a;
    pMVar9 = (Mechanization *)&(pMVar9->type).b;
    pdVar14 = pdVar14 + 1;
  }
  type_01.c = (double)in_stack_ffffffffffffffb8;
  type_01.a = (double)in_stack_ffffffffffffffa8._0_8_;
  type_01.b = (double)in_stack_ffffffffffffffa8._8_8_;
  type_01.alpha = (double)in_stack_ffffffffffffffc0;
  type_01.e2 = (double)in_stack_ffffffffffffffc8;
  type_01.e1_2 = (double)in_stack_ffffffffffffffd0._0_8_;
  type_01.gama_a = (double)in_stack_ffffffffffffffd0._8_8_;
  type_01.gama_b = (double)in_stack_ffffffffffffffd0._16_8_;
  type_01.GM = (double)in_stack_ffffffffffffffd0._24_8_;
  dVar21 = RM(dVar22,type_01);
  dVar22 = (this->prvPosi).B;
  dVar21 = ((((this->nowVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] +
             (this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0]) * 0.5) / (dVar21 + ((this->prvPosi).H + (this->nowPosi).H) * 0.5)) /
           200.0 + dVar22;
  (this->nowPosi).B = dVar21;
  pMVar9 = this;
  pdVar14 = (double *)&stack0xffffffffffffffa8;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pdVar14 = (pMVar9->type).a;
    pMVar9 = (Mechanization *)((long)pMVar9 + (ulong)bVar18 * -0x10 + 8);
    pdVar14 = pdVar14 + (ulong)bVar18 * -2 + 1;
  }
  type_02.c = (double)in_stack_ffffffffffffffb8;
  type_02.a = (double)in_stack_ffffffffffffffa8._0_8_;
  type_02.b = (double)in_stack_ffffffffffffffa8._8_8_;
  type_02.alpha = (double)in_stack_ffffffffffffffc0;
  type_02.e2 = (double)in_stack_ffffffffffffffc8;
  type_02.e1_2 = (double)in_stack_ffffffffffffffd0._0_8_;
  type_02.gama_a = (double)in_stack_ffffffffffffffd0._8_8_;
  type_02.gama_b = (double)in_stack_ffffffffffffffd0._16_8_;
  type_02.GM = (double)in_stack_ffffffffffffffd0._24_8_;
  RN((dVar21 + dVar22) * 0.5,type_02);
  pMStack_88 = this;
  uStack_170 = in_stack_ffffffffffffffb8;
  uStack_168 = in_stack_ffffffffffffffc0;
  uStack_160 = in_stack_ffffffffffffffc8;
  dStack_190 = pdVar14[0x1c];
  dStack_188 = pdVar14[0x1d];
  dStack_180 = pdVar14[0x1e];
  QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = 0.08333333333333333;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&dStack_190,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&uStack_170);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)aQStack_290,(double *)&QStack_310,aSStack_2b0);
  apMStack_248[0] = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&uStack_170;
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&MStack_108,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)apMStack_248);
  VStack_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = MStack_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
  VStack_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = MStack_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
  VStack_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = MStack_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
  Vec2Qua((Quaterniond *)aSStack_2b0,&VStack_1b0);
  dVar22 = (pdVar14[0xf] + pdVar14[0x12]) * 0.5;
  dVar21 = (pdVar14[0x11] + pdVar14[0x14]) * 0.5;
  lVar8 = 9;
  pdVar10 = pdVar14;
  ppMVar11 = apMStack_248;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *ppMVar11 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pdVar10;
    pdVar10 = pdVar10 + (ulong)bVar18 * -2 + 1;
    ppMVar11 = ppMVar11 + (ulong)bVar18 * -2 + 1;
  }
  dVar3 = pdVar14[0x15];
  dVar28 = pdVar14[0x16];
  dVar5 = pdVar14[0x18];
  dVar6 = pdVar14[0x19];
  pdVar10 = pdVar14;
  pdVar15 = (double *)&stack0xfffffffffffffc70;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar15 = *pdVar10;
    pdVar10 = pdVar10 + (ulong)bVar18 * -2 + 1;
    pdVar15 = pdVar15 + (ulong)bVar18 * -2 + 1;
  }
  type.b = (double)in_stack_fffffffffffffc78;
  type.a = in_stack_fffffffffffffc70;
  type.c = (double)in_stack_fffffffffffffc80;
  type.alpha = in_stack_fffffffffffffc88;
  type.e2 = (double)in_stack_fffffffffffffc90._0_8_;
  type.e1_2 = (double)in_stack_fffffffffffffc90._8_8_;
  type.gama_a = (double)in_stack_fffffffffffffc90._16_8_;
  type.gama_b = (double)in_stack_fffffffffffffc90._24_8_;
  type.GM = (double)in_stack_fffffffffffffc90._32_8_;
  dVar1 = RN(dVar22,type);
  ppMVar11 = apMStack_248;
  puVar13 = (undefined8 *)&stack0xfffffffffffffc70;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar13 = *ppMVar11;
    ppMVar11 = ppMVar11 + (ulong)bVar18 * -2 + 1;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
  }
  type_00.b = (double)in_stack_fffffffffffffc78;
  type_00.a = in_stack_fffffffffffffc70;
  type_00.c = (double)in_stack_fffffffffffffc80;
  type_00.alpha = in_stack_fffffffffffffc88;
  type_00.e2 = (double)in_stack_fffffffffffffc90._0_8_;
  type_00.e1_2 = (double)in_stack_fffffffffffffc90._8_8_;
  type_00.gama_a = (double)in_stack_fffffffffffffc90._16_8_;
  type_00.gama_b = (double)in_stack_fffffffffffffc90._24_8_;
  type_00.GM = (double)in_stack_fffffffffffffc90._32_8_;
  dVar2 = RM(dVar22,type_00);
  dVar28 = (dVar6 + dVar28) * 0.5;
  dVar2 = dVar2 + dVar21;
  dVar1 = dVar1 + dVar21;
  uVar19 = SUB84(dVar1,0);
  uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
  auVar26._8_4_ = uVar19;
  auVar26._0_8_ = dVar2;
  auVar26._12_4_ = uVar20;
  auVar23._8_8_ = dVar28;
  auVar23._0_8_ = (dVar5 + dVar3) * -0.5;
  auVar24._8_4_ = uVar19;
  auVar24._0_8_ = dVar2;
  auVar24._12_4_ = uVar20;
  auVar24 = divpd(auVar23,auVar24);
  dVar21 = tan(dVar22);
  dStack_328 = auVar26._8_8_;
  dStack_1c0 = (dVar21 * -dVar28) / dStack_328;
  auStack_1d0._0_8_ = auVar24._8_8_;
  auStack_1d0._8_4_ = auVar24._0_4_;
  auStack_1d0._12_4_ = auVar24._4_4_;
  dVar21 = cos(dVar22);
  adStack_120[2] = sin(dVar22);
  QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = (double)adStack_120;
  adStack_120[1] = 0.0;
  adStack_120[2] = adStack_120[2] * -7.292115e-05;
  dStack_2d0 = 1.0;
  QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = (double)auStack_1d0;
  adStack_120[0] = dVar21 * 7.292115e-05;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)aQStack_290,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
               *)&QStack_310,&dStack_2d0);
  aiStack_2f0[0] = 200;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)apMStack_248,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)aQStack_290,aiStack_2f0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&MStack_138,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)apMStack_248);
  VStack_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = MStack_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
  VStack_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = MStack_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
  VStack_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = MStack_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
  Vec2Qua(&QStack_310,&VStack_1f0);
  dStack_2d0 = -QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0];
  uStack_2c8 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1]._0_4_;
  uStack_2c4 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1]._4_4_ ^ 0x80000000;
  uVar27 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2]._4_4_ ^ 0x80000000;
  uStack_2c0 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[2]._0_4_;
  uStack_2bc = uVar27;
  uStack_2b8 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3]._0_4_;
  uStack_2b4 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3]._4_4_;
  eu.pitch = in_stack_fffffffffffffd80.m_other;
  eu.roll = (double)in_stack_fffffffffffffd78;
  eu.yaw = (double)in_stack_fffffffffffffd88;
  Eu2Ro(eu);
  dVar22 = pdVar14[10];
  Eu2Qu(in_stack_fffffffffffffdf8);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)aQStack_290,
             (QuaternionBase<Eigen::Quaternion<double,0>> *)&dStack_2d0,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)aiStack_2f0);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)aQStack_f0,aQStack_290,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)aSStack_2b0);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::normalize(aQStack_f0);
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            ((RotationMatrixType *)aQStack_290,
             (RotationBase<Eigen::Quaternion<double,_0>,_3> *)aQStack_f0);
  C = &MStack_d0;
  pQVar12 = aQStack_290;
  pMVar16 = C;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = *(double *)pQVar12;
    pQVar12 = pQVar12 + ((ulong)bVar18 * -2 + 1) * 8;
    pMVar16 = (Matrix3d *)((long)pMVar16 + ((ulong)bVar18 * -2 + 1) * 8);
  }
  uVar19 = QStack_310.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2]._0_4_;
  CalculateEuler(C,&VStack_150);
  lVar8 = 9;
  puVar13 = (undefined8 *)&stack0xfffffffffffffc90;
  puVar17 = (undefined8 *)&stack0xfffffffffffffba8;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar17 = *puVar13;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  dVar21 = RN(dVar22,in_stack_fffffffffffffba8);
  puVar13 = (undefined8 *)&stack0xfffffffffffffc90;
  puVar17 = (undefined8 *)&stack0xfffffffffffffba8;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar17 = *puVar13;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
  }
  dVar3 = RM(dVar22,in_stack_fffffffffffffba8);
  dVar22 = tan(dVar22);
  auVar25._4_4_ = extraout_XMM0_Db;
  auVar25._0_4_ = extraout_XMM0_Da;
  auVar25._8_8_ = CONCAT44(uVar27,uVar19) ^ 0x8000000000000000;
  auVar4._8_8_ = in_stack_fffffffffffffc88 + dVar3;
  auVar4._0_8_ = in_stack_fffffffffffffc88 + dVar21;
  auVar26 = divpd(auVar25,auVar4);
  *(undefined1 (*) [16])
   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array =
       auVar26;
  (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       (dVar22 * -(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) /
       (in_stack_fffffffffffffc88 + dVar21);
  return SUB81(C,0);
}

Assistant:

bool Mechanization::UpdatePosi(Output now) {
    this->nowPosi.H = prvPosi.H - 0.5 * (prvVel(2, 0) + nowVel(2, 0)) * 1.0 / ZCF;
    // cout << this->nowPosi.H << endl;

    double rm = RM(prvPosi.B, type);
    double h = 0.5 * (nowPosi.H + prvPosi.H);
    this->nowPosi.B = prvPosi.B + 0.5 * (prvVel(0, 0) + nowVel(0, 0)) / (rm + h) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.B) << endl;
    
    double phi = 0.5 * (prvPosi.B + nowPosi.B);
    double rn = RN(phi, type);
    // cout << setprecision(15) << rn << endl;
    this->nowPosi.L = prvPosi.L + 0.5 * (prvVel(1, 0) + nowVel(1, 0)) / ((rn + h) * cos(phi)) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.L) << endl;
}